

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

int Curl_socket_check(curl_socket_t readfd0,curl_socket_t readfd1,curl_socket_t writefd,
                     long timeout_ms)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  nfds_t __nfds;
  bool bVar8;
  timeval newer;
  pollfd pfd [3];
  pollfd local_58 [3];
  timeval local_40;
  
  if ((readfd1 & readfd0 & writefd) == 0xffffffff) {
    iVar1 = Curl_wait_ms((int)timeout_ms);
    return iVar1;
  }
  if (timeout_ms < 1) {
    uVar7 = 0;
    local_40 = (timeval)ZEXT816(0);
  }
  else {
    local_40 = curlx_tvnow();
    uVar7 = timeout_ms & 0xffffffff;
  }
  bVar8 = readfd0 != -1;
  if (bVar8) {
    local_58[0].events = 0xc3;
    local_58[0].revents = 0;
    local_58[0].fd = readfd0;
  }
  __nfds = (nfds_t)bVar8;
  if (readfd1 != -1) {
    local_58[__nfds].fd = readfd1;
    local_58[__nfds].events = 0xc3;
    local_58[__nfds].revents = 0;
    __nfds = (nfds_t)(bVar8 + 1);
  }
  if (writefd != -1) {
    local_58[__nfds].fd = writefd;
    local_58[__nfds].events = 0x104;
    local_58[__nfds].revents = 0;
    __nfds = (nfds_t)((int)__nfds + 1);
  }
  if (timeout_ms == 0) {
    uVar7 = 0;
  }
  if (timeout_ms < 0) {
    uVar7 = 0xffffffff;
  }
  iVar1 = poll(local_58,__nfds,(int)uVar7);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    do {
      if (*piVar2 != 0) {
        if (*piVar2 != 4) {
          return -1;
        }
        if (Curl_ack_eintr != 0) {
          return -1;
        }
      }
      if (0 < timeout_ms) {
        newer = curlx_tvnow();
        lVar3 = curlx_tvdiff(newer,local_40);
        uVar6 = (int)timeout_ms - (int)lVar3;
        uVar7 = (ulong)uVar6;
        if ((int)uVar6 < 1) goto LAB_004c12e7;
      }
      if (timeout_ms == 0) {
        uVar7 = 0;
      }
      if (timeout_ms < 0) {
        uVar7 = 0xffffffff;
      }
      iVar1 = poll(local_58,__nfds,(int)uVar7);
    } while (iVar1 == -1);
  }
  uVar6 = 0xffffffff;
  if (-1 < iVar1) {
    if (iVar1 == 0) {
LAB_004c12e7:
      uVar6 = 0;
    }
    else {
      if (readfd0 == -1) {
        uVar6 = 0;
        uVar4 = 0;
      }
      else {
        bVar8 = (local_58[0]._4_4_ & 0x590000) != 0;
        uVar6 = bVar8 + 4;
        if ((local_58[0]._4_4_ & 0xa20000) == 0) {
          uVar6 = (uint)bVar8;
        }
        uVar4 = 1;
      }
      if (readfd1 != -1) {
        uVar5 = uVar6 + 8;
        if ((local_58[uVar4].revents & 0x59U) == 0) {
          uVar5 = uVar6;
        }
        uVar6 = uVar5 | 4;
        if ((local_58[uVar4].revents & 0xa2U) == 0) {
          uVar6 = uVar5;
        }
        uVar4 = uVar4 + 1;
      }
      if (writefd != -1) {
        uVar5 = uVar6 | 2;
        if ((local_58[uVar4].revents & 0x104U) == 0) {
          uVar5 = uVar6;
        }
        uVar6 = uVar5 | 4;
        if ((local_58[uVar4].revents & 0x38U) == 0) {
          uVar6 = uVar5;
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int Curl_socket_check(curl_socket_t readfd0, /* two sockets to read from */
                      curl_socket_t readfd1,
                      curl_socket_t writefd, /* socket to write to */
                      long timeout_ms)       /* milliseconds to wait */
{
#ifdef HAVE_POLL_FINE
  struct pollfd pfd[3];
  int num;
#else
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct timeval initial_tv = {0, 0};
  int pending_ms = 0;
  int error;
  int r;
  int ret;

  if((readfd0 == CURL_SOCKET_BAD) && (readfd1 == CURL_SOCKET_BAD) &&
     (writefd == CURL_SOCKET_BAD)) {
    /* no sockets, just wait */
    r = Curl_wait_ms((int)timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid curlx_tvnow() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = (int)timeout_ms;
    initial_tv = curlx_tvnow();
  }

#ifdef HAVE_POLL_FINE

  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd0;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd1;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    pfd[num].fd = writefd;
    pfd[num].events = POLLWRNORM|POLLOUT;
    pfd[num].revents = 0;
    num++;
  }

  do {
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(pfd, num, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = (int)(timeout_ms - elapsed_ms);
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  ret = 0;
  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      ret |= CURL_CSELECT_IN;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      ret |= CURL_CSELECT_IN2;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLWRNORM|POLLOUT))
      ret |= CURL_CSELECT_OUT;
    if(pfd[num].revents & (POLLERR|POLLHUP|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
  }

  return ret;

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  FD_ZERO(&fds_read);
  if(readfd0 != CURL_SOCKET_BAD) {
    VERIFY_SOCK(readfd0);
    FD_SET(readfd0, &fds_read);
    FD_SET(readfd0, &fds_err);
    maxfd = readfd0;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    VERIFY_SOCK(readfd1);
    FD_SET(readfd1, &fds_read);
    FD_SET(readfd1, &fds_err);
    if(readfd1 > maxfd)
      maxfd = readfd1;
  }

  FD_ZERO(&fds_write);
  if(writefd != CURL_SOCKET_BAD) {
    VERIFY_SOCK(writefd);
    FD_SET(writefd, &fds_write);
    FD_SET(writefd, &fds_err);
    if(writefd > maxfd)
      maxfd = writefd;
  }

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }

    /* WinSock select() must not be called with an fd_set that contains zero
       fd flags, or it will return WSAEINVAL.  But, it also can't be called
       with no fd_sets at all!  From the documentation:

         Any two of the parameters, readfds, writefds, or exceptfds, can be
         given as null. At least one must be non-null, and any non-null
         descriptor set must contain at least one handle to a socket.

       We know that we have at least one bit set in at least two fd_sets in
       this case, but we may have no bits set in either fds_read or fd_write,
       so check for that and handle it.  Luckily, with WinSock, we can _also_
       ask how many bits are set on an fd_set.

       It is unclear why WinSock doesn't just handle this for us instead of
       calling this an error.

       Note also that WinSock ignores the first argument, so we don't worry
       about the fact that maxfd is computed incorrectly with WinSock (since
       curl_socket_t is unsigned in such cases and thus -1 is the largest
       value).
    */
    r = select((int)maxfd + 1,
#ifndef USE_WINSOCK
               &fds_read,
               &fds_write,
#else
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
#endif
               &fds_err, ptimeout);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  ret = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(FD_ISSET(readfd0, &fds_read))
      ret |= CURL_CSELECT_IN;
    if(FD_ISSET(readfd0, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(FD_ISSET(readfd1, &fds_read))
      ret |= CURL_CSELECT_IN2;
    if(FD_ISSET(readfd1, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(FD_ISSET(writefd, &fds_write))
      ret |= CURL_CSELECT_OUT;
    if(FD_ISSET(writefd, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }

  return ret;

#endif  /* HAVE_POLL_FINE */

}